

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int archive_read_format_7zip_cleanup(archive_read *a)

{
  _7z_stream_info *si;
  int iVar1;
  
  si = (_7z_stream_info *)a->format->data;
  free_StreamsInfo(si);
  free(si[1].ci.folders);
  free((void *)si[1].ss.unpack_streams);
  if (*(int *)&si[4].pi.digest.digests != 0) {
    lzma_end((lzma_stream *)(si + 3));
  }
  if (*(int *)&si[5].pi.sizes != 0) {
    iVar1 = BZ2_bzDecompressEnd((bz_stream *)&si[4].pi.positions);
    if (iVar1 != 0) {
      archive_set_error(&a->archive,-1,"Failed to clean up bzip2 decompressor");
    }
    *(undefined4 *)&si[5].pi.sizes = 0;
  }
  if (*(int *)&si[6].pi.digest.digests != 0) {
    iVar1 = cm_zlib_inflateEnd((z_streamp)&si[5].pi.digest);
    if (iVar1 != 0) {
      archive_set_error(&a->archive,-1,"Failed to clean up zlib decompressor");
    }
    *(undefined4 *)&si[6].pi.digest.digests = 0;
  }
  if ((int)si[0xc0].pi.pos != 0) {
    Ppmd7_Free((CPpmd7 *)&si[6].pi.positions,&g_szalloc);
    *(undefined4 *)&si[0xc0].pi.pos = 0;
  }
  free((void *)si[2].pi.numPackStreams);
  free((void *)si[0xc0].ci.numFolders);
  free(si[0xc0].ci.folders);
  free((void *)si[0xc0].ci.dataStreamIndex);
  free(si[0xc1].pi.sizes);
  free(si);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_7zip_cleanup(struct archive_read *a)
{
	struct _7zip *zip;

	zip = (struct _7zip *)(a->format->data);
	free_StreamsInfo(&(zip->si));
	free(zip->entries);
	free(zip->entry_names);
	free_decompression(a, zip);
	free(zip->uncompressed_buffer);
	free(zip->sub_stream_buff[0]);
	free(zip->sub_stream_buff[1]);
	free(zip->sub_stream_buff[2]);
	free(zip->tmp_stream_buff);
	free(zip);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}